

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

bool __thiscall
metaf::VisibilityGroup::appendMeters(VisibilityGroup *this,string *group,IncompleteText next)

{
  bool bVar1;
  optional<metaf::Distance> v;
  _Storage<metaf::Distance,_true> local_2c;
  char local_1c;
  
  Distance::fromMeterString((optional<metaf::Distance> *)&local_2c._M_value,group);
  if ((local_1c == '\x01') &&
     ((local_2c._M_value.dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>._M_engaged != false ||
      (local_2c._M_value.distModifier - DISTANT < 2)))) {
    (this->vis).distModifier = local_2c._0_4_;
    (this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._M_payload =
         (_Storage<unsigned_int,_true>)local_2c._4_4_;
    *(ulong *)&(this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_engaged =
         CONCAT71(local_2c._9_7_,
                  local_2c._M_value.dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int>._M_engaged);
    this->incompleteText = next;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool VisibilityGroup::appendMeters(const std::string & group, IncompleteText next) {
	const auto v = Distance::fromMeterString(group);
	if (!v.has_value()) return false;
	if (!v->isReported()) return false;
	vis = *v;
	incompleteText = next;
	return true;
}